

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManTransformMiter2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  
  uVar6 = p->vCos->nSize - p->nRegs;
  iVar8 = (int)uVar6 / 2;
  if ((uVar6 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xb96,"Gia_Man_t *Gia_ManTransformMiter2(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCi(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar6 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar6;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManObj(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iVar2 = Gia_ObjFanin1Copy(pGVar4);
      uVar6 = Gia_ManHashAnd(p_00,iVar1,iVar2);
      pGVar4->Value = uVar6;
    }
  }
  for (iVar7 = 0; iVar7 < p->vCos->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(p,iVar7);
    if ((iVar8 == iVar7) || (pGVar4 == (Gia_Obj_t *)0x0)) break;
    pObj = Gia_ManPo(p,iVar8 + iVar7);
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    iVar2 = Gia_ObjFanin0Copy(pObj);
    iVar1 = Gia_ManHashXor(p_00,iVar1,iVar2);
    Gia_ManAppendCo(p_00,iVar1);
  }
  for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar8);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar7 = Gia_ObjFanin0Copy(pGVar4);
    uVar6 = Gia_ManAppendCo(p_00,iVar7);
    pGVar4->Value = uVar6;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManTransformMiter2( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, iLit, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(pObj2) );
        Gia_ManAppendCo( pNew, iLit );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}